

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint8_t uVar1;
  char **argv_local;
  int argc_local;
  
  uVar1 = IT8951_Init();
  if (uVar1 == '\0') {
    IT8951WaitForDisplayReady();
    if (argc != 2) {
      printf("Error: argc!=2.\n");
      exit(1);
    }
    IT8951_BMP_Example(0,0,argv[1]);
    IT8951_Cancel();
    argv_local._4_4_ = 0;
  }
  else {
    printf("IT8951_Init error \n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char *argv[])
{
	if(IT8951_Init())
	{
		printf("IT8951_Init error \n");
		return 1;
	}

    IT8951WaitForDisplayReady();

	if (argc != 2)
	{
		printf("Error: argc!=2.\n");
		exit(1);
	}

	IT8951_BMP_Example(0, 0,argv[1]);
	
	IT8951_Cancel();

	return 0;
}